

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O1

void __thiscall
ikfast::IkSolution<double>::GetSolution
          (IkSolution<double> *this,vector<double,_std::allocator<double>_> *solution,
          vector<double,_std::allocator<double>_> *freevalues)

{
  pointer pdVar1;
  pointer pdVar2;
  int iVar3;
  pointer pdVar4;
  
  iVar3 = (*(this->super_IkSolutionBase<double>)._vptr_IkSolutionBase[5])();
  std::vector<double,_std::allocator<double>_>::resize(solution,(long)iVar3);
  pdVar1 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    pdVar2 = (freevalues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (pointer)0x0;
    if ((freevalues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish != pdVar2) {
      pdVar4 = pdVar2;
    }
    (*(this->super_IkSolutionBase<double>)._vptr_IkSolutionBase[2])(this,pdVar1,pdVar4);
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  return;
}

Assistant:

virtual void GetSolution(std::vector<T>& solution, const std::vector<T>& freevalues) const {
        solution.resize(GetDOF());
        GetSolution(&solution.at(0), freevalues.size() > 0 ? &freevalues.at(0) : NULL);
    }